

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O0

bool __thiscall FOptionMenuItemSafeCommand::Activate(FOptionMenuItemSafeCommand *this)

{
  bool bVar1;
  char *pcVar2;
  char *local_50;
  char *local_48;
  FName local_38 [4];
  FString local_28;
  FString FullString;
  char *actionLabel;
  char *msg;
  FOptionMenuItemSafeCommand *this_local;
  
  bVar1 = FString::IsNotEmpty(&this->mPrompt);
  if (bVar1) {
    local_48 = FString::GetChars(&this->mPrompt);
  }
  else {
    local_48 = "$SAFEMESSAGE";
  }
  actionLabel = local_48;
  if (*local_48 == '$') {
    actionLabel = FStringTable::operator()(&GStrings,local_48 + 1);
  }
  FullString.Chars =
       FString::GetChars(&(this->super_FOptionMenuItemCommand).super_FOptionMenuItemSubmenu.
                          super_FOptionMenuItem.mLabel);
  if ((FullString.Chars != (char *)0x0) && (*FullString.Chars == '$')) {
    FullString.Chars = FStringTable::operator()(&GStrings,FullString.Chars + 1);
  }
  FString::FString(&local_28);
  if (FullString.Chars == (char *)0x0) {
    local_50 = "";
  }
  else {
    local_50 = FullString.Chars;
  }
  FString::Format(&local_28,"\x1cJ%s\x1c-\n\n%s",local_50,actionLabel);
  if ((actionLabel != (char *)0x0) &&
     (pcVar2 = FString::operator_cast_to_char_(&local_28), pcVar2 != (char *)0x0)) {
    pcVar2 = FString::operator_cast_to_char_(&local_28);
    FName::FName(local_38,NAME_None);
    M_StartMessage(pcVar2,0,local_38);
  }
  FString::~FString(&local_28);
  return true;
}

Assistant:

bool Activate()
	{
		const char *msg = mPrompt.IsNotEmpty() ? mPrompt.GetChars() : "$SAFEMESSAGE";
		if (*msg == '$')
		{
			msg = GStrings(msg + 1);
		}

		const char *actionLabel = mLabel.GetChars();
		if (actionLabel != NULL)
		{
			if (*actionLabel == '$')
			{
				actionLabel = GStrings(actionLabel + 1);
			}
		}

		FString FullString;
		FullString.Format(TEXTCOLOR_WHITE "%s" TEXTCOLOR_NORMAL "\n\n" "%s", actionLabel != NULL ? actionLabel : "", msg);

		if (msg && FullString) M_StartMessage(FullString, 0);
		return true;
	}